

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

Config * __thiscall QPDFJob::Config::collate(Config *this,string *parameter)

{
  bool bVar1;
  ulong uVar2;
  element_type *peVar3;
  char *str;
  value_type_conflict4 local_a8;
  int local_a0;
  uint local_9c;
  size_t local_98 [3];
  allocator<char> local_79;
  string local_78;
  string local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> n;
  size_type end;
  size_t pos;
  string *local_20;
  string *parameter_local;
  Config *this_local;
  
  local_20 = parameter;
  parameter_local = (string *)this;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    do {
      n.field_2._8_8_ = std::__cxx11::string::find((char)local_20,0x2c);
      std::__cxx11::string::substr((ulong)local_58,(ulong)local_20);
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"--collate: trailing comma",&local_79);
        usage(&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::allocator<char>::~allocator(&local_79);
      }
      peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this->o);
      str = (char *)std::__cxx11::string::c_str();
      local_9c = QUtil::string_to_uint(str);
      local_98[0] = QIntC::to_size<unsigned_int>(&local_9c);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&peVar3->collate,local_98);
      if (n.field_2._8_8_ == -1) {
        local_a0 = 3;
      }
      else {
        local_a0 = 0;
      }
      std::__cxx11::string::~string(local_58);
    } while (local_a0 == 0);
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this->o);
    bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(&peVar3->collate);
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this->o);
      local_a8 = 1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&peVar3->collate,&local_a8);
    }
  }
  else {
    peVar3 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this->o);
    pos = 1;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&peVar3->collate,&pos);
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::collate(std::string const& parameter)
{
    if (parameter.empty()) {
        o.m->collate.push_back(1);
        return this;
    }
    size_t pos = 0;
    // Parse a,b,c
    while (true) {
        auto end = parameter.find(',', pos);
        auto n = parameter.substr(pos, end);
        if (n.empty()) {
            usage("--collate: trailing comma");
        }
        o.m->collate.push_back(QIntC::to_size(QUtil::string_to_uint(n.c_str())));
        if (end == std::string::npos) {
            break;
        }
        pos = end + 1;
    }
    if (o.m->collate.empty()) {
        o.m->collate.push_back(1);
    }
    return this;
}